

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O2

int OPENSSL_posix_to_tm(int64_t time,tm *out_tm)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  iVar4 = 0;
  if (0xffffffb68697427f < time - 0x3afff44180U) {
    uVar6 = time % 0x15180;
    lVar7 = ((long)uVar6 >> 0x3f) + time / 0x15180;
    iVar4 = (int)(time / 0x15180) + (int)((long)uVar6 >> 0x3f) + 0xafa6c;
    if (lVar7 < -0xafa6b) {
      iVar4 = (int)lVar7 + 0x8bfbc;
    }
    uVar8 = lVar7 + (long)(iVar4 / 0x23ab1) * -0x23ab1 + 0xafa6c;
    uVar5 = (int)uVar8 >> 0x1f;
    iVar9 = (int)((long)((ulong)uVar5 << 0x20 | uVar8 & 0xffffffff) / -0x23ab0) +
            (int)((long)((ulong)uVar5 << 0x20 | uVar8 & 0xffffffff) / 0x8eac) +
            (int)((long)((ulong)uVar5 << 0x20 | uVar8 & 0xffffffff) / -0x5b4) + (int)uVar8;
    lVar7 = (long)(iVar9 / -0x5b4) + uVar8 + (long)(iVar9 / 0x8e94) + (long)(iVar9 / 0x16d) * -0x16d
    ;
    iVar1 = (int)lVar7;
    iVar2 = (iVar1 * 5 + 2) / 0x99;
    iVar3 = iVar2 + 3;
    if (0x131 < lVar7) {
      iVar3 = iVar2 + -9;
    }
    uVar8 = (ulong)((int)uVar6 + 0x15180);
    if (-1 < (long)uVar6) {
      uVar8 = uVar6 & 0xffffffff;
    }
    uVar5 = (uint)(ushort)(uVar8 % 0xe10);
    out_tm->tm_sec = uVar5 % 0x3c;
    out_tm->tm_min = uVar5 / 0x3c;
    out_tm->tm_hour = (int)(uVar8 / 0xe10);
    out_tm->tm_mday = iVar1 + (iVar2 * 0x99 + 2) / -5 + 1;
    out_tm->tm_mon = iVar3 + -1;
    out_tm->tm_year = (uint)(iVar3 < 3) + iVar9 / 0x16d + (iVar4 / 0x23ab1) * 400 + -0x76c;
    out_tm->tm_wday = 0;
    out_tm->tm_yday = 0;
    *(undefined8 *)&out_tm->tm_isdst = 0;
    out_tm->tm_gmtoff = 0;
    out_tm->tm_zone = (char *)0x0;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int OPENSSL_posix_to_tm(int64_t time, struct tm *out_tm) {
  struct tm tmp_tm = {};
  if (!utc_from_posix_time(time, &tmp_tm.tm_year, &tmp_tm.tm_mon,
                           &tmp_tm.tm_mday, &tmp_tm.tm_hour, &tmp_tm.tm_min,
                           &tmp_tm.tm_sec)) {
    return 0;
  }
  tmp_tm.tm_year -= 1900;
  tmp_tm.tm_mon -= 1;
  *out_tm = tmp_tm;

  return 1;
}